

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::UnicodeString::unescape(UnicodeString *__return_storage_ptr__,UnicodeString *this)

{
  char16_t *pcVar1;
  short sVar2;
  ushort uVar3;
  int iVar4;
  ushort uVar5;
  UChar32 srcChar;
  char16_t *srcChars;
  long lVar6;
  int iVar7;
  int32_t iVar8;
  int32_t i;
  
  sVar2 = (this->fUnion).fStackFields.fLengthAndFlags;
  if (sVar2 < 0) {
    iVar8 = (this->fUnion).fFields.fLength;
  }
  else {
    iVar8 = (int)sVar2 >> 5;
  }
  UnicodeString(__return_storage_ptr__,iVar8,0,0);
  if ((undefined1  [56])((undefined1  [56])__return_storage_ptr__->fUnion & (undefined1  [56])0x1)
      == (undefined1  [56])0x0) {
    srcChars = getBuffer(this);
    sVar2 = (this->fUnion).fStackFields.fLengthAndFlags;
    iVar4 = (int)sVar2 >> 5;
    if (sVar2 < 0) {
      iVar4 = (this->fUnion).fFields.fLength;
    }
    i = 0;
    while( true ) {
      iVar8 = i;
      iVar7 = 1;
      lVar6 = (long)i;
      do {
        if (iVar4 == (int)lVar6) {
          doAppend(__return_storage_ptr__,srcChars,iVar8,iVar4 - iVar8);
          return __return_storage_ptr__;
        }
        i = (int32_t)(lVar6 + 1);
        iVar7 = iVar7 + -1;
        pcVar1 = srcChars + lVar6;
        lVar6 = lVar6 + 1;
      } while (*pcVar1 != L'\\');
      doAppend(__return_storage_ptr__,srcChars,iVar8,-iVar7);
      srcChar = unescapeAt(this,&i);
      if (srcChar < 0) break;
      append(__return_storage_ptr__,srcChar);
    }
    uVar3 = (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags;
    uVar5 = 2;
    if ((uVar3 & 1) == 0) {
      uVar5 = uVar3 & 0x1e;
    }
    (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = uVar5;
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString UnicodeString::unescape() const {
    UnicodeString result(length(), (UChar32)0, (int32_t)0); // construct with capacity
    if (result.isBogus()) {
        return result;
    }
    const UChar *array = getBuffer();
    int32_t len = length();
    int32_t prev = 0;
    for (int32_t i=0;;) {
        if (i == len) {
            result.append(array, prev, len - prev);
            break;
        }
        if (array[i++] == 0x5C /*'\\'*/) {
            result.append(array, prev, (i - 1) - prev);
            UChar32 c = unescapeAt(i); // advances i
            if (c < 0) {
                result.remove(); // return empty string
                break; // invalid escape sequence
            }
            result.append(c);
            prev = i;
        }
    }
    return result;
}